

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O0

void SimpleLoggerMgr::handleSegFault(int sig)

{
  bool bVar1;
  SimpleLoggerMgr *pSVar2;
  int in_EDI;
  SimpleLoggerMgr *unaff_retaddr;
  string *in_stack_00000010;
  int in_stack_0000001c;
  SimpleLoggerMgr *in_stack_00000020;
  SimpleLoggerMgr *mgr;
  size_t in_stack_000001a0;
  SimpleLoggerMgr *in_stack_000001a8;
  allocator local_31;
  string local_30 [24];
  SimpleLoggerMgr *in_stack_ffffffffffffffe8;
  
  pSVar2 = get();
  signal(0xb,(__sighandler_t)pSVar2->oldSigSegvHandler);
  enableOnlyOneDisplayer(unaff_retaddr);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Segmentation fault",&local_31);
  flushAllLoggers(in_stack_00000020,in_stack_0000001c,in_stack_00000010);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  logStackBacktrace(in_stack_000001a8,in_stack_000001a0);
  printf("[SEG FAULT] Flushed all logs safely.\n");
  fflush(_stdout);
  bVar1 = chkExitOnCrash(in_stack_ffffffffffffffe8);
  if (!bVar1) {
    if (pSVar2->oldSigSegvHandler != (_func_void_int *)0x0) {
      (*pSVar2->oldSigSegvHandler)(in_EDI);
    }
    return;
  }
  printf("[SEG FAULT] Exit on crash.\n");
  fflush(_stdout);
  exit(-1);
}

Assistant:

void SimpleLoggerMgr::handleSegFault(int sig) {
#if defined(__linux__) || defined(__APPLE__)
    SimpleLoggerMgr* mgr = SimpleLoggerMgr::get();
    signal(SIGSEGV, mgr->oldSigSegvHandler);
    mgr->enableOnlyOneDisplayer();
    mgr->flushAllLoggers(1, "Segmentation fault");
    mgr->logStackBacktrace();

    printf("[SEG FAULT] Flushed all logs safely.\n");
    fflush(stdout);

    if (mgr->chkExitOnCrash()) {
        printf("[SEG FAULT] Exit on crash.\n");
        fflush(stdout);
        exit(-1);
    }

    if (mgr->oldSigSegvHandler) {
        mgr->oldSigSegvHandler(sig);
    }
#endif
}